

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O0

void __thiscall wasm::AlignmentLowering::visitStore(AlignmentLowering *this,Store *curr)

{
  Binary *value_00;
  Index IVar1;
  bool bVar2;
  Module *pMVar3;
  Block *expression;
  address64_t aVar4;
  Unary *pUVar5;
  Memory *pMVar6;
  Function *pFVar7;
  LocalGet *pLVar8;
  Store *pSVar9;
  Const *right;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> local_180;
  LocalSet *local_170;
  Expression *local_168;
  Expression *local_160;
  Expression *local_158;
  initializer_list<wasm::Expression_*> local_150;
  pointer local_140;
  pointer local_138;
  Type local_130;
  uintptr_t local_128;
  Address local_120;
  Type local_118;
  Binary *local_110;
  Expression *high;
  pointer local_100;
  Type local_f8;
  uintptr_t local_f0;
  Address local_e8;
  Type local_e0;
  Unary *local_d8;
  Expression *low;
  LocalSet *setValue;
  Index local_bc;
  LocalSet *pLStack_b8;
  Index tempValue;
  LocalSet *setPtr;
  Index local_a4;
  Type TStack_a0;
  Index tempPtr;
  Type addressType;
  Memory *mem;
  Expression *value;
  Type local_70;
  Block *local_68;
  Expression *replacement;
  BasicType type;
  undefined1 local_50;
  Drop *local_48;
  Drop *local_40;
  initializer_list<wasm::Expression_*> local_38;
  BasicType local_24;
  Builder local_20;
  Builder builder;
  Store *curr_local;
  AlignmentLowering *this_local;
  
  builder.wasm = (Module *)curr;
  pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                       .
                       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                     );
  Builder::Builder(&local_20,pMVar3);
  local_24 = unreachable;
  bVar2 = wasm::Type::operator==
                    ((Type *)&((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_24);
  if (bVar2) {
    local_48 = Builder::makeDrop(&local_20,
                                 (Expression *)
                                 ((builder.wasm)->globals).
                                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    local_40 = Builder::makeDrop(&local_20,
                                 (Expression *)
                                 ((builder.wasm)->globals).
                                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    local_38._M_array = (iterator)&local_48;
    local_38._M_len = 2;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&type);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)_type;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_50;
    expression = Builder::makeBlock(&local_20,&local_38,type_00);
    Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                ).
                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                .
                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
               ,(Expression *)expression);
  }
  else {
    aVar4 = wasm::Address::operator_cast_to_unsigned_long
                      ((Address *)
                       &((builder.wasm)->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if ((aVar4 != 0) &&
       (aVar4 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)
                           &((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish),
       aVar4 != *(byte *)&((builder.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
      replacement._0_4_ =
           wasm::Type::getBasic
                     ((Type *)(((builder.wasm)->globals).
                               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 1));
      switch((BasicType)replacement) {
      case i32:
        local_68 = (Block *)lowerStoreI32(this,(Store *)builder.wasm);
        break;
      case i64:
      case f64:
        if (((BasicType)replacement == i64) &&
           (*(char *)&((builder.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != '\b')) {
          wasm::Type::Type((Type *)&value,i32);
          ((builder.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)value;
          pUVar5 = Builder::makeUnary(&local_20,WrapInt64,
                                      (Expression *)
                                      ((builder.wasm)->globals).
                                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
          ((builder.wasm)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar5;
          local_68 = (Block *)lowerStoreI32(this,(Store *)builder.wasm);
        }
        else {
          mem = (Memory *)
                ((builder.wasm)->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          if ((BasicType)replacement == f64) {
            mem = (Memory *)Builder::makeUnary(&local_20,ReinterpretFloat64,(Expression *)mem);
          }
          pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                              ).
                              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                              .
                              super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            );
          addressType.id =
               (uintptr_t)
               ((builder.wasm)->tags).
               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pMVar6 = Module::getMemory(pMVar3,(IString)*(IString *)
                                                      &((builder.wasm)->tags).
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
          TStack_a0.id = (pMVar6->addressType).id;
          pFVar7 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                   getFunction(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                                ).
                                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                                .
                                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                              );
          setPtr = (LocalSet *)TStack_a0.id;
          local_a4 = Builder::addVar(pFVar7,TStack_a0);
          pLStack_b8 = Builder::makeLocalSet
                                 (&local_20,local_a4,
                                  (Expression *)
                                  ((builder.wasm)->globals).
                                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          pFVar7 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                   getFunction(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                                ).
                                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                                .
                                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                              );
          wasm::Type::Type((Type *)&setValue,i64);
          local_bc = Builder::addVar(pFVar7,(Type)setValue);
          low = (Expression *)Builder::makeLocalSet(&local_20,local_bc,(Expression *)mem);
          IVar1 = local_bc;
          wasm::Type::Type(&local_e0,i64);
          pLVar8 = Builder::makeLocalGet(&local_20,IVar1,local_e0);
          local_d8 = Builder::makeUnary(&local_20,WrapInt64,(Expression *)pLVar8);
          local_e8.addr =
               (address64_t)
               ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          aVar4 = wasm::Address::operator_cast_to_unsigned_long
                            ((Address *)
                             &((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          local_f0 = TStack_a0.id;
          pLVar8 = Builder::makeLocalGet(&local_20,local_a4,TStack_a0);
          pUVar5 = local_d8;
          wasm::Type::Type(&local_f8,i32);
          high = (Expression *)
                 ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          local_100 = ((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pSVar9 = Builder::makeStore(&local_20,4,local_e8,(uint)aVar4,(Expression *)pLVar8,
                                      (Expression *)pUVar5,local_f8,
                                      (IString)*(IString *)
                                                &((builder.wasm)->tags).
                                                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                 ._M_impl.super__Vector_impl_data);
          local_d8 = (Unary *)lowerStoreI32(this,pSVar9);
          IVar1 = local_bc;
          wasm::Type::Type(&local_118,i64);
          pLVar8 = Builder::makeLocalGet(&local_20,IVar1,local_118);
          right = Builder::makeConst<long>(&local_20,0x20);
          local_110 = Builder::makeBinary(&local_20,ShrUInt64,(Expression *)pLVar8,
                                          (Expression *)right);
          local_110 = (Binary *)Builder::makeUnary(&local_20,WrapInt64,(Expression *)local_110);
          aVar4 = wasm::Address::operator_cast_to_unsigned_long
                            ((Address *)&(builder.wasm)->functions);
          wasm::Address::Address(&local_120,aVar4 + 4);
          aVar4 = wasm::Address::operator_cast_to_unsigned_long
                            ((Address *)
                             &((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          local_128 = TStack_a0.id;
          pLVar8 = Builder::makeLocalGet(&local_20,local_a4,TStack_a0);
          value_00 = local_110;
          wasm::Type::Type(&local_130,i32);
          local_140 = ((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_138 = ((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pSVar9 = Builder::makeStore(&local_20,4,local_120,(uint)aVar4,(Expression *)pLVar8,
                                      (Expression *)value_00,local_130,
                                      (IString)*(IString *)
                                                &((builder.wasm)->tags).
                                                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                 ._M_impl.super__Vector_impl_data);
          local_158 = lowerStoreI32(this,pSVar9);
          local_170 = pLStack_b8;
          local_168 = low;
          local_160 = (Expression *)local_d8;
          local_150._M_array = (iterator)&local_170;
          local_150._M_len = 4;
          local_110 = (Binary *)local_158;
          std::optional<wasm::Type>::optional(&local_180);
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_180.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_180.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          local_68 = Builder::makeBlock(&local_20,&local_150,type_01);
        }
        break;
      case f32:
        wasm::Type::Type(&local_70,i32);
        ((builder.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_70.id;
        pUVar5 = Builder::makeUnary(&local_20,ReinterpretFloat32,
                                    (Expression *)
                                    ((builder.wasm)->globals).
                                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
        ((builder.wasm)->globals).
        super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar5;
        local_68 = (Block *)lowerStoreI32(this,(Store *)builder.wasm);
        break;
      default:
        handle_unreachable("unhandled unaligned store",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x14e);
      }
      Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                  .
                  super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                 ,(Expression *)local_68);
    }
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    Builder builder(*getModule());
    // If unreachable, just remove the store, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(builder.makeBlock(
        {builder.makeDrop(curr->ptr), builder.makeDrop(curr->value)}));
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    auto type = curr->value->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned store");
      case Type::i32:
        replacement = lowerStoreI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        curr->value = builder.makeUnary(ReinterpretFloat32, curr->value);
        replacement = lowerStoreI32(curr);
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A store of <64 bits.
          curr->type = Type::i32;
          curr->value = builder.makeUnary(WrapInt64, curr->value);
          replacement = lowerStoreI32(curr);
          break;
        }
        // Otherwise, fall through to f64 case for a 64-bit load.
        // Ensure an integer input value.
        auto* value = curr->value;
        if (type == Type::f64) {
          value = builder.makeUnary(ReinterpretFloat64, value);
        }
        // Store as two 32-bit pieces.
        auto mem = getModule()->getMemory(curr->memory);
        auto addressType = mem->addressType;
        auto tempPtr = builder.addVar(getFunction(), addressType);
        auto* setPtr = builder.makeLocalSet(tempPtr, curr->ptr);
        auto tempValue = builder.addVar(getFunction(), Type::i64);
        auto* setValue = builder.makeLocalSet(tempValue, value);
        Expression* low = builder.makeUnary(
          WrapInt64, builder.makeLocalGet(tempValue, Type::i64));
        low = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            low,
                            Type::i32,
                            curr->memory));
        Expression* high =
          builder.makeBinary(ShrUInt64,
                             builder.makeLocalGet(tempValue, Type::i64),
                             builder.makeConst(int64_t(32)));
        high = builder.makeUnary(WrapInt64, high);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned store, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        high = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset + 4,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            high,
                            Type::i32,
                            curr->memory));
        replacement = builder.makeBlock({setPtr, setValue, low, high});
        break;
    }
    replaceCurrent(replacement);
  }